

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O2

void __thiscall serfloat_tests::doubles::test_method(doubles *this)

{
  bool bVar1;
  uint64_t uVar2;
  int i;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar6;
  assertion_result local_150;
  char *local_138;
  assertion_result local_130;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  double j;
  int local_ec;
  char *local_e8;
  char *local_e0;
  lazy_ostream local_d8;
  undefined ***local_c8;
  char **local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  DataStream local_98;
  undefined1 local_78 [16];
  lazy_ostream *local_68;
  char *pcStack_60;
  undefined1 local_58 [24];
  int *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.m_read_pos = 0;
  local_98.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar3 = 0; iVar3 != 1000; iVar3 = iVar3 + 1) {
    uVar2 = EncodeDouble((double)iVar3);
    ser_writedata64<DataStream>(&local_98,uVar2);
  }
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8e;
  file.m_begin = (iterator)&local_a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  Hash<DataStream>((uint256 *)local_58,&local_98);
  local_78._0_8_ = (undefined **)0x557f0d7878b23f96;
  local_78._8_8_ = 0xa01585d25b25d433;
  local_68 = (lazy_ostream *)0xafe114590d392676;
  pcStack_60 = (char *)0x43d0c82591953c4e;
  bVar1 = ::operator==((base_blob<256U> *)local_58,(base_blob<256U> *)local_78);
  local_150.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_150.m_message.px = (element_type *)0x0;
  local_150.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = (char **)&local_130;
  local_130._0_8_ =
       "Hash(ss) == uint256{\"43d0c82591953c4eafe114590d392676a01585d25b25d433557f0d7878b23f96\"}";
  local_130.m_message.px = (element_type *)0xc1b76b;
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = (undefined ***)boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_d8,1,0,WARN,_cVar6,(size_t)&local_e8,0x8e);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  for (local_ec = 0; local_ec < 1000; local_ec = local_ec + 1) {
    uVar2 = ser_readdata64<DataStream>(&local_98);
    j = DecodeDouble(uVar2);
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x95;
    file_00.m_begin = (iterator)&local_108;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
               msg_00);
    local_130.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)((double)local_ec == j);
    local_130.m_message.px = (element_type *)0x0;
    local_130.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_150.m_message.px = (element_type *)((ulong)local_150.m_message.px & 0xffffffffffffff00);
    local_150._0_8_ = &PTR__lazy_ostream_0114c730;
    local_150.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_138 = "decoded:";
    local_d8.m_empty = false;
    local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0114c770;
    local_c8 = (undefined ***)&local_150;
    local_c0 = (char **)&j;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_0114c7b0;
    local_68 = &local_d8;
    pcStack_60 = " expected:";
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_0114c7f0;
    local_58._16_8_ = local_78;
    local_40 = &local_ec;
    pvVar4 = &DAT_00000001;
    pvVar5 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              (&local_130,(lazy_ostream *)local_58,1,1,WARN,0xc1aaa0,
               (size_t)&stack0xfffffffffffffea0,0x95);
    boost::detail::shared_count::~shared_count(&local_130.m_message.pn);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(doubles)
{
    DataStream ss{};
    // encode
    for (int i = 0; i < 1000; i++) {
        ss << EncodeDouble(i);
    }
    BOOST_CHECK(Hash(ss) == uint256{"43d0c82591953c4eafe114590d392676a01585d25b25d433557f0d7878b23f96"});

    // decode
    for (int i = 0; i < 1000; i++) {
        uint64_t val;
        ss >> val;
        double j = DecodeDouble(val);
        BOOST_CHECK_MESSAGE(i == j, "decoded:" << j << " expected:" << i);
    }
}